

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

long calculator::toBase<long,16ul>(string *s)

{
  long v;
  stringstream ss;
  long local_198;
  stringstream local_190 [16];
  long local_180 [3];
  uint auStack_168 [88];
  
  std::__cxx11::stringstream::stringstream(local_190);
  *(uint *)((long)auStack_168 + *(long *)(local_180[0] + -0x18)) =
       *(uint *)((long)auStack_168 + *(long *)(local_180[0] + -0x18)) & 0xffffffb5 | 8;
  std::operator<<((ostream *)local_180,(string *)s);
  std::istream::_M_extract<long>((long *)local_190);
  std::__cxx11::stringstream::~stringstream(local_190);
  return local_198;
}

Assistant:

inline T toBase(const std::string& s) {
    std::stringstream ss;
    if (Base == 16)
        ss << std::hex << s;
    else if (Base == 8)
        ss << std::oct << s;
    else if (Base == 2)
        return std::bitset<32>(s).to_ulong();
    T v;
    ss >> v;
    return v;
}